

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall cmDocumentation::addCommonStandardDocSections(cmDocumentation *this)

{
  cmDocumentationSection *pcVar1;
  mapped_type *ppcVar2;
  allocator local_49;
  key_type local_48;
  cmDocumentationSection *local_18;
  cmDocumentationSection *sec;
  cmDocumentation *this_local;
  
  sec = (cmDocumentationSection *)this;
  pcVar1 = (cmDocumentationSection *)operator_new(0x38);
  cmDocumentationSection::cmDocumentationSection(pcVar1,"Options","OPTIONS");
  local_18 = pcVar1;
  cmDocumentationSection::Append(pcVar1,cmDocumentationStandardOptions);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"Options",&local_49);
  ppcVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
            ::operator[](&this->AllSections,&local_48);
  *ppcVar2 = pcVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void cmDocumentation::addCommonStandardDocSections()
{
  cmDocumentationSection* sec;

  sec = new cmDocumentationSection("Options", "OPTIONS");
  sec->Append(cmDocumentationStandardOptions);
  this->AllSections["Options"] = sec;
}